

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

void av1_rd_pick_inter_mode_sb_seg_skip
               (AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,int mi_row,int mi_col,
               RD_STATS *rd_cost,BLOCK_SIZE bsize,PICK_MODE_CONTEXT *ctx,int64_t best_rd_so_far)

{
  AV1_COMMON *cm;
  MACROBLOCKD *xd;
  undefined8 uVar1;
  char cVar2;
  bool bVar3;
  TransformationType TVar4;
  InterpFilter interp_filter;
  bool bVar5;
  ushort uVar6;
  int iVar7;
  MB_MODE_INFO *pMVar8;
  byte bVar9;
  uint8_t uVar10;
  InterpFilter IVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  WarpedMotionParams *pWVar17;
  uint uVar18;
  int iVar19;
  uint32_t uVar20;
  int iVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  byte local_21c;
  int pts [16];
  uint ref_costs_single [8];
  int pts_inref [16];
  uint ref_costs_comp [8] [8];
  
  cm = &cpi->common;
  xd = &x->e_mbd;
  pMVar8 = *(x->e_mbd).mi;
  uVar6 = *(ushort *)&pMVar8->field_0xa7;
  local_21c = (byte)uVar6 & 7;
  iVar12 = av1_get_reference_mode_context(xd);
  av1_collect_neighbors_ref_counts(xd);
  estimate_ref_frame_costs(cm,xd,&x->mode_costs,uVar6 & 7,ref_costs_single,ref_costs_comp);
  for (lVar16 = 0x9598; lVar16 != 0x95a0; lVar16 = lVar16 + 1) {
    *(undefined4 *)((long)&x->plane[0].src_diff + lVar16 * 4) = 0x7fffffff;
  }
  for (lVar16 = 0x575d; lVar16 != 0x5764; lVar16 = lVar16 + 1) {
    *(undefined4 *)((long)&x->plane[0].src_diff + lVar16 * 4) = 0x7fffffff;
  }
  rd_cost->rate = 0x7fffffff;
  (pMVar8->palette_mode_info).palette_size[0] = '\0';
  (pMVar8->palette_mode_info).palette_size[1] = '\0';
  (pMVar8->filter_intra_mode_info).use_filter_intra = '\0';
  pMVar8->mode = '\x0f';
  pMVar8->uv_mode = '\0';
  pMVar8->motion_mode = '\0';
  if (((cpi->common).seg.enabled == '\0') ||
     (((cpi->common).seg.feature_mask[local_21c] & 0x20) == 0)) {
    pMVar8->ref_frame[0] = '\x01';
    lVar16 = 1;
  }
  else {
    cVar2 = (char)(cpi->common).seg.feature_data[local_21c][5];
    lVar16 = (long)cVar2;
    pMVar8->ref_frame[0] = cVar2;
  }
  pMVar8->ref_frame[1] = -1;
  pWVar17 = (cpi->common).global_motion + lVar16;
  bVar3 = (cpi->common).features.cur_frame_force_integer_mv;
  TVar4 = (cpi->common).global_motion[lVar16].wmtype;
  uVar22 = (ulong)bsize;
  if (TVar4 == '\x01') {
    uVar1 = *(undefined8 *)pWVar17->wmmat;
    auVar23._0_4_ = (uint)uVar1 >> 0xd;
    auVar23._4_4_ = (uint)((ulong)uVar1 >> 0x2d);
    auVar23._8_8_ = 0;
    auVar23 = pshuflw(auVar23,auVar23,0xe8);
    pts[0] = auVar23._0_4_;
  }
  else {
    if (TVar4 == '\0') {
      pts[0] = 0;
      goto LAB_009462d5;
    }
    bVar5 = (cpi->common).features.allow_high_precision_mv;
    iVar21 = (uint)(block_size_wide[uVar22] >> 1) + mi_col * 4 + -1;
    iVar19 = (uint)(block_size_high[uVar22] >> 1) + mi_row * 4 + -1;
    iVar13 = (cpi->common).global_motion[lVar16].wmmat[4];
    iVar14 = (cpi->common).global_motion[lVar16].wmmat[5];
    iVar7 = (cpi->common).global_motion[lVar16].wmmat[1];
    iVar15 = convert_to_trans_prec
                       ((uint)bVar5,
                        ((cpi->common).global_motion[lVar16].wmmat[2] + -0x10000) * iVar21 +
                        pWVar17->wmmat[0] + (cpi->common).global_motion[lVar16].wmmat[3] * iVar19);
    iVar13 = convert_to_trans_prec
                       ((uint)bVar5,iVar21 * iVar13 + iVar7 + (iVar14 + -0x10000) * iVar19);
    pts[0] = CONCAT22((short)iVar15,(short)iVar13);
  }
  if (bVar3 != false) {
    integer_mv_precision((MV *)pts);
  }
LAB_009462d5:
  pMVar8->mv[0].as_int = pts[0];
  pMVar8->tx_size = ""[uVar22];
  (x->txfm_search_info).skip_txfm = '\x01';
  pMVar8->field_0xa7 = pMVar8->field_0xa7 & 0xcf;
  pMVar8->motion_mode = '\0';
  av1_count_overlappable_neighbors(cm,xd);
  bVar9 = block_size_high[uVar22];
  if (block_size_wide[uVar22] < block_size_high[uVar22]) {
    bVar9 = block_size_wide[uVar22];
  }
  if ((7 < bVar9) && (pMVar8->ref_frame[1] < '\x01')) {
    bVar9 = av1_findSamples(cm,xd,pts,pts_inref);
    pMVar8->num_proj_ref = bVar9;
    if (1 < bVar9) {
      uVar10 = av1_selectSamples(&pMVar8->mv[0].as_mv,pts,pts_inref,(uint)bVar9,bsize);
      pMVar8->num_proj_ref = uVar10;
    }
  }
  interp_filter = (cpi->common).features.interp_filter;
  uVar18 = (uint)interp_filter;
  IVar11 = EIGHTTAP_REGULAR;
  if (interp_filter != MULTITAP_SHARP2) {
    IVar11 = interp_filter;
  }
  (pMVar8->interp_filters).as_int = (uint)IVar11 * 0x10001;
  if (interp_filter == MULTITAP_SHARP2) {
    iVar13 = av1_is_interp_needed(xd);
    uVar20 = 0;
    if (iVar13 == 0) {
      uVar18 = 0;
    }
    else {
      iVar13 = 0x7fffffff;
      uVar18 = 0;
      for (; uVar20 != 0x30003; uVar20 = uVar20 + 0x10001) {
        (pMVar8->interp_filters).as_int = uVar20;
        iVar14 = av1_get_switchable_rate
                           (x,xd,MULTITAP_SHARP2,
                            (uint)((cpi->common).seq_params)->enable_dual_filter);
        if (iVar14 < iVar13) {
          uVar18 = (uint)*(byte *)&pMVar8->interp_filters;
          iVar13 = iVar14;
        }
      }
    }
  }
  (pMVar8->interp_filters).as_int = uVar18 * 0x10001;
  iVar13 = av1_get_switchable_rate
                     (x,xd,interp_filter,(uint)((cpi->common).seq_params)->enable_dual_filter);
  if ((cpi->common).current_frame.reference_mode == '\x02') {
    iVar13 = iVar13 + (x->mode_costs).comp_inter_cost[iVar12][0];
  }
  iVar12 = x->rdmult;
  rd_cost->rate = iVar13 + ref_costs_single[1];
  rd_cost->dist = 0;
  lVar16 = (long)iVar12 * (long)(int)(iVar13 + ref_costs_single[1]) + 0x100 >> 9;
  rd_cost->rdcost = lVar16;
  if (lVar16 < best_rd_so_far) {
    iVar12 = (cpi->sf).inter_sf.adaptive_rd_thresh;
    if (iVar12 != 0) {
      av1_update_rd_thresh_fact(cm,x->thresh_freq_fact,iVar12,bsize,'\x15','\0',0x9c,0x9c,0xa9);
    }
    store_coding_context(x,ctx,0);
  }
  else {
    rd_cost->rate = 0x7fffffff;
    rd_cost->rdcost = 0x7fffffffffffffff;
  }
  return;
}

Assistant:

void av1_rd_pick_inter_mode_sb_seg_skip(const AV1_COMP *cpi,
                                        TileDataEnc *tile_data, MACROBLOCK *x,
                                        int mi_row, int mi_col,
                                        RD_STATS *rd_cost, BLOCK_SIZE bsize,
                                        PICK_MODE_CONTEXT *ctx,
                                        int64_t best_rd_so_far) {
  const AV1_COMMON *const cm = &cpi->common;
  const FeatureFlags *const features = &cm->features;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  unsigned char segment_id = mbmi->segment_id;
  const int comp_pred = 0;
  int i;
  unsigned int ref_costs_single[REF_FRAMES];
  unsigned int ref_costs_comp[REF_FRAMES][REF_FRAMES];
  const ModeCosts *mode_costs = &x->mode_costs;
  const int *comp_inter_cost =
      mode_costs->comp_inter_cost[av1_get_reference_mode_context(xd)];
  InterpFilter best_filter = SWITCHABLE;
  int64_t this_rd = INT64_MAX;
  int rate2 = 0;
  const int64_t distortion2 = 0;
  (void)mi_row;
  (void)mi_col;
  (void)tile_data;

  av1_collect_neighbors_ref_counts(xd);

  estimate_ref_frame_costs(cm, xd, mode_costs, segment_id, ref_costs_single,
                           ref_costs_comp);

  for (i = 0; i < REF_FRAMES; ++i) x->pred_sse[i] = INT_MAX;
  for (i = LAST_FRAME; i < REF_FRAMES; ++i) x->pred_mv_sad[i] = INT_MAX;

  rd_cost->rate = INT_MAX;

  assert(segfeature_active(&cm->seg, segment_id, SEG_LVL_SKIP));

  mbmi->palette_mode_info.palette_size[0] = 0;
  mbmi->palette_mode_info.palette_size[1] = 0;
  mbmi->filter_intra_mode_info.use_filter_intra = 0;
  mbmi->mode = GLOBALMV;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->uv_mode = UV_DC_PRED;
  if (segfeature_active(&cm->seg, segment_id, SEG_LVL_REF_FRAME))
    mbmi->ref_frame[0] = get_segdata(&cm->seg, segment_id, SEG_LVL_REF_FRAME);
  else
    mbmi->ref_frame[0] = LAST_FRAME;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->mv[0].as_int =
      gm_get_motion_vector(&cm->global_motion[mbmi->ref_frame[0]],
                           features->allow_high_precision_mv, bsize, mi_col,
                           mi_row, features->cur_frame_force_integer_mv)
          .as_int;
  mbmi->tx_size = max_txsize_lookup[bsize];
  x->txfm_search_info.skip_txfm = 1;

  mbmi->ref_mv_idx = 0;

  mbmi->motion_mode = SIMPLE_TRANSLATION;
  av1_count_overlappable_neighbors(cm, xd);
  if (is_motion_variation_allowed_bsize(bsize) && !has_second_ref(mbmi)) {
    int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
    mbmi->num_proj_ref = av1_findSamples(cm, xd, pts, pts_inref);
    // Select the samples according to motion vector difference
    if (mbmi->num_proj_ref > 1) {
      mbmi->num_proj_ref = av1_selectSamples(&mbmi->mv[0].as_mv, pts, pts_inref,
                                             mbmi->num_proj_ref, bsize);
    }
  }

  const InterpFilter interp_filter = features->interp_filter;
  set_default_interp_filters(mbmi, interp_filter);

  if (interp_filter != SWITCHABLE) {
    best_filter = interp_filter;
  } else {
    best_filter = EIGHTTAP_REGULAR;
    if (av1_is_interp_needed(xd)) {
      int rs;
      int best_rs = INT_MAX;
      for (i = 0; i < SWITCHABLE_FILTERS; ++i) {
        mbmi->interp_filters = av1_broadcast_interp_filter(i);
        rs = av1_get_switchable_rate(x, xd, interp_filter,
                                     cm->seq_params->enable_dual_filter);
        if (rs < best_rs) {
          best_rs = rs;
          best_filter = mbmi->interp_filters.as_filters.y_filter;
        }
      }
    }
  }
  // Set the appropriate filter
  mbmi->interp_filters = av1_broadcast_interp_filter(best_filter);
  rate2 += av1_get_switchable_rate(x, xd, interp_filter,
                                   cm->seq_params->enable_dual_filter);

  if (cm->current_frame.reference_mode == REFERENCE_MODE_SELECT)
    rate2 += comp_inter_cost[comp_pred];

  // Estimate the reference frame signaling cost and add it
  // to the rolling cost variable.
  rate2 += ref_costs_single[LAST_FRAME];
  this_rd = RDCOST(x->rdmult, rate2, distortion2);

  rd_cost->rate = rate2;
  rd_cost->dist = distortion2;
  rd_cost->rdcost = this_rd;

  if (this_rd >= best_rd_so_far) {
    rd_cost->rate = INT_MAX;
    rd_cost->rdcost = INT64_MAX;
    return;
  }

  assert((interp_filter == SWITCHABLE) ||
         (interp_filter == mbmi->interp_filters.as_filters.y_filter));

  if (cpi->sf.inter_sf.adaptive_rd_thresh) {
    av1_update_rd_thresh_fact(cm, x->thresh_freq_fact,
                              cpi->sf.inter_sf.adaptive_rd_thresh, bsize,
                              THR_GLOBALMV, THR_INTER_MODE_START,
                              THR_INTER_MODE_END, THR_DC, MAX_MODES);
  }

#if CONFIG_INTERNAL_STATS
  store_coding_context(x, ctx, THR_GLOBALMV, 0);
#else
  store_coding_context(x, ctx, 0);
#endif  // CONFIG_INTERNAL_STATS
}